

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O0

int cmime_list_remove(CMimeList_T *list,CMimeListElem_T *elem,void **data)

{
  void **data_local;
  CMimeListElem_T *elem_local;
  CMimeList_T *list_local;
  
  if ((elem == (CMimeListElem_T *)0x0) || (list->size == 0)) {
    if (list == (CMimeList_T *)0x0) {
      __assert_fail("list",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                    ,0x41,"int cmime_list_remove(CMimeList_T *, CMimeListElem_T *, void **)");
    }
    if (elem == (CMimeListElem_T *)0x0) {
      __assert_fail("elem",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                    ,0x42,"int cmime_list_remove(CMimeList_T *, CMimeListElem_T *, void **)");
    }
    list_local._4_4_ = -1;
  }
  else {
    *data = elem->data;
    if (elem == list->head) {
      list->head = elem->next;
      if (list->head == (CMimeListElem_T *)0x0) {
        list->tail = (CMimeListElem_T *)0x0;
      }
      else {
        list->head->prev = (_CMimeListElem *)0x0;
      }
    }
    else {
      elem->prev->next = elem->next;
      if (elem->next == (_CMimeListElem *)0x0) {
        list->tail = elem->prev;
      }
      else {
        elem->next->prev = elem->prev;
      }
    }
    free(elem);
    list->size = list->size + -1;
    list_local._4_4_ = 0;
  }
  return list_local._4_4_;
}

Assistant:

int cmime_list_remove(CMimeList_T *list, CMimeListElem_T *elem, void **data) {
    /* no null element and no empty list */
    if(elem == NULL || cmime_list_size(list) == 0) {
        assert(list);
        assert(elem);
        return(-1);
    }
 
    *data = elem->data;
        
    /* handle removal of first element */
    if(elem == cmime_list_head(list)) {
        list->head = elem->next;
 
        if(list->head == NULL) {
            list->tail = NULL;
        } else {
            list->head->prev = NULL;
        }
    } else {
        elem->prev->next = elem->next;
 
        if(elem->next == NULL) {
            list->tail = elem->prev;
        } else {
            elem->next->prev = elem->prev;
        }
    }
 
    free(elem);
    list->size--;

    return(0);
}